

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O3

char * string_trim(char *string,string_edge_e which)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  size_t sVar5;
  
  sVar1 = strlen(string);
  if (((which & ~STRING_BOTH) == STRING_START) && (sVar2 = strspn(string," \t\n\r\f"), sVar2 != 0))
  {
    sVar1 = sVar1 - sVar2;
    memmove(string,string + sVar2,sVar1 + 1);
  }
  sVar2 = sVar1;
  if (which - STRING_END < 2) {
    do {
      sVar5 = sVar2;
      if ((long)sVar5 < 1) {
        pcVar4 = string;
        sVar5 = sVar1;
        if (-1 < (long)sVar1) goto LAB_00112126;
        break;
      }
      pvVar3 = memchr(" \t\n\r\f",(int)string[sVar5 - 1],6);
      sVar2 = sVar5 - 1;
    } while (pvVar3 != (void *)0x0);
    pcVar4 = string + sVar5;
LAB_00112126:
    *pcVar4 = '\0';
  }
  return string;
}

Assistant:

char *
string_trim(char *string, enum string_edge_e which)
{
    size_t len;

    len = strlen(string);
    if (which == STRING_START || which == STRING_BOTH) {
        size_t sub = strspn(string, " \t\n\r\f");
        if (sub > 0) {
            memmove(string, string + sub, len + 1 - sub);
            len -= sub;
        }
    }
    if (which == STRING_END || which == STRING_BOTH) {
        long sub = len;
        while (--sub >= 0)
            if (strchr(" \t\n\r\f", string[sub]) == NULL)
                break;
        if (sub == -1)
            string[0] = '\0';
        else
            string[sub+1] = '\0';
    }
    return string;
}